

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O1

vm_obj_id_t __thiscall
CVmObject::find_intcls_for_mod(CVmObject *this,vm_obj_id_t self,vm_obj_id_t mod_obj)

{
  uint self_00;
  vm_meta_entry_t *pvVar1;
  CVmMetaTable *pCVar2;
  int iVar3;
  vm_obj_id_t vVar4;
  undefined4 extraout_var;
  long lVar5;
  undefined4 in_register_00000034;
  
  pCVar2 = G_meta_table_X;
  iVar3 = (**this->_vptr_CVmObject)(this,CONCAT44(in_register_00000034,self));
  pvVar1 = pCVar2->table_;
  lVar5 = (long)pCVar2->reverse_map_[*(uint *)(CONCAT44(extraout_var,iVar3) + 8)];
  if ((pvVar1 != (vm_meta_entry_t *)0x0 && -1 < lVar5) &&
     (self_00 = pvVar1[lVar5].class_obj_, self_00 != 0)) {
    vVar4 = CVmObjClass::find_mod_src_obj
                      ((CVmObjClass *)
                       ((long)&G_obj_table_X.pages_[self_00 >> 0xc]->ptr_ +
                       (ulong)((self_00 & 0xfff) * 0x18)),self_00,mod_obj);
    return vVar4;
  }
  return 0;
}

Assistant:

vm_obj_id_t CVmObject::find_intcls_for_mod(VMG_ vm_obj_id_t self,
                                           vm_obj_id_t mod_obj)
{
    /* get my metaclass from the dependency table */
    vm_meta_entry_t *entry = (G_meta_table
             ->get_entry_from_reg(get_metaclass_reg()->get_reg_idx()));

    /* 
     *   if there's an intrinsic class object for the metaclass, ask it to do
     *   the work 
     */
    if (entry != 0 && entry->class_obj_ != VM_INVALID_OBJ)
        return (((CVmObjClass *)vm_objp(vmg_ entry->class_obj_))
                ->find_mod_src_obj(vmg_ entry->class_obj_, mod_obj));

    /* there's no intrinsic metaclass, so we can't find what we need */
    return VM_INVALID_OBJ;
}